

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O2

Oop __thiscall Lodtalk::Behavior::lookupSelector(Behavior *this,Oop selector)

{
  Oop OVar1;
  
  while( true ) {
    if (this->methodDict == (MethodDictionary *)&NilObject) {
      return (Oop)(uint8_t *)&NilObject;
    }
    OVar1 = MethodDictionary::internalAtOrNil(this->methodDict,selector);
    if (OVar1.field_0 != (anon_union_8_4_0eb573b0_for_Oop_0)&NilObject) break;
    this = this->superclass;
    if (this == (Behavior *)&NilObject) {
      return (Oop)(uint8_t *)&NilObject;
    }
  }
  return (Oop)OVar1.field_0.pointer;
}

Assistant:

Oop Behavior::lookupSelector(Oop selector)
{
	// Sanity check.
	if(isNil(methodDict))
		return nilOop();

	// Look the method in the dictionary.
	auto method = methodDict->atOrNil(selector);
	if(!isNil(method))
		return method;

	// Find in the super class.
	if(isNil(superclass))
		return nilOop();
	return superclass->lookupSelector(selector);
}